

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warnings.cpp
# Opt level: O3

vector<bilingual_str,_std::allocator<bilingual_str>_> * __thiscall
node::Warnings::GetMessages
          (vector<bilingual_str,_std::allocator<bilingual_str>_> *__return_storage_ptr__,
          Warnings *this)

{
  _Base_ptr p_Var1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock2;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_owns = false;
  local_30._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_30);
  (__return_storage_ptr__->super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::reserve
            (__return_storage_ptr__,
             (this->m_warnings)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var1 = (this->m_warnings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_warnings)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var1)) {
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
              (__return_storage_ptr__,(value_type *)&p_Var1[1]._M_parent);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<bilingual_str> Warnings::GetMessages() const
{
    LOCK(m_mutex);
    std::vector<bilingual_str> messages;
    messages.reserve(m_warnings.size());
    for (const auto& [id, msg] : m_warnings) {
        messages.push_back(msg);
    }
    return messages;
}